

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

void __thiscall BMP::~BMP(BMP *this)

{
  GreyCount *pGVar1;
  pointer pcVar2;
  int iVar3;
  Alphabet *pAVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  
  pAVar4 = this->alphabet;
  pGVar1 = pAVar4->symbol;
  if (pGVar1 != (GreyCount *)0x0) {
    lVar6 = *(long *)((long)&pGVar1[-1].codeHuffman.field_2 + 8);
    if (lVar6 != 0) {
      paVar5 = &pGVar1[lVar6 + -1].codeShannonFano.field_2;
      lVar6 = lVar6 * -0x80;
      do {
        if (paVar5 + 2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)paVar5[1]._M_allocated_capacity) {
          operator_delete((void *)paVar5[1]._M_allocated_capacity);
        }
        pcVar2 = (((string *)(paVar5 + -1))->_M_dataplus)._M_p;
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2) {
          operator_delete(pcVar2);
        }
        if (paVar5 + -2 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)paVar5[-3]._M_allocated_capacity) {
          operator_delete((void *)paVar5[-3]._M_allocated_capacity);
        }
        paVar5 = paVar5 + -8;
        lVar6 = lVar6 + 0x80;
      } while (lVar6 != 0);
    }
    operator_delete__(&pGVar1[-1].codeHuffman.field_2);
    pAVar4 = this->alphabet;
    if (pAVar4 == (Alphabet *)0x0) goto LAB_00103707;
  }
  operator_delete__(pAVar4);
LAB_00103707:
  iVar3 = (this->headInfo).biWidth;
  if (0 < iVar3) {
    lVar6 = 0;
    do {
      if (this->field[lVar6] != (uchar *)0x0) {
        operator_delete__(this->field[lVar6]);
        iVar3 = (this->headInfo).biWidth;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
  }
  if (this->field != (uchar **)0x0) {
    operator_delete__(this->field);
    return;
  }
  return;
}

Assistant:

BMP::~BMP()
{
    using namespace bitMap;

    delete[] alphabet->symbol;
    delete[] alphabet;

    for ( int i = 0; i < headInfo.biWidth; i++ ){
        delete[] field[ i ];
    }
    delete[] field;
}